

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtilityTests.cpp
# Opt level: O2

void __thiscall IndexingTest_GetLinearIndex_Test::TestBody(IndexingTest_GetLinearIndex_Test *this)

{
  char *pcVar1;
  AssertHelper local_28;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  AssertionResult gtest_ar;
  
  local_28.data_._0_4_ = 0x1f;
  local_20.ptr_._0_4_ = local_28.data_._0_4_;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"6 * 2 * 2 + 2 * 3 + 1",
             "getLinearIndex(Int3(4, 6, 2), Int3(2, 3, 1))",(int *)&local_20,(int *)&local_28);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_20);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/utility/UtilityTests.cpp"
               ,0x5a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_20);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    local_20.ptr_._0_4_ = 0x13a;
    local_28.data_._0_4_ = 0x13a;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"5 * 8 * 7 + 8 * 4 + 2",
               "getLinearIndex(Int3(12, 5, 8), Int3(7, 4, 2))",(int *)&local_20,(int *)&local_28);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_20);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar1 = "";
      }
      else {
        pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/utility/UtilityTests.cpp"
                 ,0x5b,pcVar1);
      testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_20);
      testing::internal::AssertHelper::~AssertHelper(&local_28);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_20);
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(IndexingTest, GetLinearIndex)
{
    ASSERT_EQ(6 * 2 * 2 + 2 * 3 + 1, getLinearIndex(Int3(4, 6, 2), Int3(2, 3, 1)));
    ASSERT_EQ(5 * 8 * 7 + 8 * 4 + 2, getLinearIndex(Int3(12, 5, 8), Int3(7, 4, 2)));
}